

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textlabel.cpp
# Opt level: O1

void __thiscall QtMWidgets::TextLabel::paintEvent(TextLabel *this,QPaintEvent *e)

{
  int iVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  double in_XMM1_Qa;
  QPainter p;
  QRect cr;
  undefined1 auStack_58 [12];
  int iStack_4c;
  undefined8 local_48;
  int iStack_44;
  double local_40;
  double local_38;
  
  QFrame::paintEvent((QPaintEvent *)this);
  QPainter::QPainter((QPainter *)auStack_58,(QPaintDevice *)&this->field_0x10);
  join_0x00000010_0x00000000_ = QWidget::contentsRect();
  QPainter::setClipRect(auStack_58,auStack_58 + 8,1);
  QPainter::setPen((QColor *)auStack_58);
  QStaticText::textOption();
  QTextOption::~QTextOption((QTextOption *)&local_40);
  uVar2 = auStack_58._8_4_;
  iVar1 = ((this->d).d)->margin;
  iVar5 = iStack_44;
  if ((local_40._0_4_ & 0x1e0) == 0x40) {
    QStaticText::size();
    iVar4 = uVar2 + iVar1;
    iVar5 = iVar5 - ((int)((double)((ulong)in_XMM1_Qa & 0x8000000000000000 | (ulong)DAT_00183d10) +
                          in_XMM1_Qa) + ((this->d).d)->margin);
  }
  else {
    iVar3 = iStack_4c;
    if ((local_40._0_4_ & 0x1e0) == 0x80) {
      QStaticText::size();
      iVar5 = iVar5 - iVar3;
      iVar4 = uVar2 + iVar1;
      iVar5 = (((iVar5 - (iVar5 + 1 >> 0x1f)) + 1 >> 1) + iVar3) -
              (int)((double)((ulong)in_XMM1_Qa & 0x8000000000000000 | (ulong)DAT_00183d10) +
                   in_XMM1_Qa) / 2;
    }
    else {
      iVar4 = auStack_58._8_4_;
      iVar5 = iStack_4c;
      if (iVar1 != 0) {
        iVar4 = auStack_58._8_4_ + iVar1;
        iVar5 = iStack_4c + iVar1;
      }
    }
  }
  local_40 = (double)iVar4;
  local_38 = (double)iVar5;
  QPainter::drawStaticText((QPointF *)auStack_58,(QStaticText *)&local_40);
  QPainter::~QPainter((QPainter *)auStack_58);
  return;
}

Assistant:

void
TextLabel::paintEvent( QPaintEvent * e )
{
	QFrame::paintEvent( e );

	QPainter p( this );
	const QRect cr = contentsRect();

	p.setClipRect( cr );
	p.setPen( d->color );

	int vAlign = d->staticText.textOption().alignment() & Qt::AlignVertical_Mask;

	QPoint topLeft = cr.topLeft();

	switch( vAlign )
	{
		case Qt::AlignBottom :
			topLeft = QPoint( topLeft.x() + d->margin,
				cr.bottomLeft().y() - qRound( d->staticText.size().height() ) -
				d->margin );
		break;

		case Qt::AlignVCenter :
			topLeft = QPoint( topLeft.x() + d->margin,
				topLeft.y() + cr.height() / 2 -
					qRound( d->staticText.size().height() ) / 2 );
		break;

		default :
		{
			if( d->margin != 0 )
				topLeft += QPoint( d->margin, d->margin );
		}
		break;
	}

	p.drawStaticText( topLeft, d->staticText );
}